

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# docopt_private.h
# Opt level: O0

pair<unsigned_long,_std::shared_ptr<docopt::LeafPattern>_> * __thiscall
docopt::Argument::single_match(Argument *this,PatternList *left)

{
  size_type sVar1;
  __shared_ptr<docopt::Pattern,_(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *peVar2;
  value *this_01;
  vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
  *in_RDX;
  long *in_RSI;
  value *in_RDI;
  Argument *arg;
  size_t size;
  size_t i;
  pair<unsigned_long,_std::shared_ptr<docopt::LeafPattern>_> *ret;
  shared_ptr<docopt::Argument> *in_stack_ffffffffffffff68;
  LeafPattern *local_80;
  value *__args;
  ulong local_28;
  
  __args = in_RDI;
  std::pair<unsigned_long,_std::shared_ptr<docopt::LeafPattern>_>::
  pair<unsigned_long,_std::shared_ptr<docopt::LeafPattern>,_true>
            ((pair<unsigned_long,_std::shared_ptr<docopt::LeafPattern>_> *)0x1bf513);
  local_28 = 0;
  sVar1 = std::
          vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
          ::size(in_RDX);
  while( true ) {
    if (sVar1 <= local_28) {
      return (pair<unsigned_long,_std::shared_ptr<docopt::LeafPattern>_> *)__args;
    }
    this_00 = &std::
               vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
               ::operator[](in_RDX,local_28)->
               super___shared_ptr<docopt::Pattern,_(__gnu_cxx::_Lock_policy)2>;
    peVar2 = std::__shared_ptr<docopt::Pattern,_(__gnu_cxx::_Lock_policy)2>::get(this_00);
    if (peVar2 == (element_type *)0x0) {
      local_80 = (LeafPattern *)0x0;
    }
    else {
      local_80 = (LeafPattern *)__dynamic_cast(peVar2,&Pattern::typeinfo,&typeinfo,0);
    }
    if (local_80 != (LeafPattern *)0x0) break;
    local_28 = local_28 + 1;
  }
  *(ulong *)in_RDI = local_28;
  (**(code **)(*in_RSI + 0x18))();
  this_01 = docopt::LeafPattern::getValue(local_80);
  std::make_shared<docopt::Argument,std::__cxx11::string_const&,docopt::value_const&>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__args,in_RDI);
  std::shared_ptr<docopt::LeafPattern>::operator=
            ((shared_ptr<docopt::LeafPattern> *)this_01,in_stack_ffffffffffffff68);
  std::shared_ptr<docopt::Argument>::~shared_ptr((shared_ptr<docopt::Argument> *)0x1bf60b);
  return (pair<unsigned_long,_std::shared_ptr<docopt::LeafPattern>_> *)__args;
}

Assistant:

inline std::pair<size_t, std::shared_ptr<LeafPattern>> Argument::single_match(PatternList const& left) const
	{
		std::pair<size_t, std::shared_ptr<LeafPattern>> ret {};

		for(size_t i = 0, size = left.size(); i < size; ++i)
		{
			auto arg = dynamic_cast<Argument const*>(left[i].get());
			if (arg) {
				ret.first = i;
				ret.second = std::make_shared<Argument>(name(), arg->getValue());
				break;
			}
		}

		return ret;
	}